

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O0

bool __thiscall SslTcpSocketImpl::SetAcceptState(SslTcpSocketImpl *this)

{
  __int_type __i;
  size_type sVar1;
  pointer pSVar2;
  reference pvVar3;
  __tuple_element_t<1UL,_tuple<unique_ptr<unsigned_char[],_default_delete<unsigned_char[]>_>,_unsigned_long>_>
  *p_Var4;
  __tuple_element_t<0UL,_tuple<unique_ptr<unsigned_char[],_default_delete<unsigned_char[]>_>,_unsigned_long>_>
  *this_00;
  type buffer;
  deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
  *this_01;
  size_t nToCopy;
  undefined1 local_90 [7];
  bool bZeroReceived;
  DATA data;
  SslTcpSocketImpl *local_70;
  offset_in_BaseSocketImpl_to_subr local_68 [2];
  type local_58;
  function<void_()> local_40;
  undefined1 local_20 [16];
  SslTcpSocketImpl *this_local;
  
  local_20._8_8_ = this;
  sVar1 = std::
          vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
          ::size(&this->m_pServerCtx);
  if (sVar1 == 0) {
    this_local._7_1_ = false;
  }
  else {
    std::vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
    ::front(&this->m_pServerCtx);
    std::make_unique<OpenSSLWrapper::SslConnection,OpenSSLWrapper::SslServerContext&>
              ((SslServerContext *)local_20);
    std::
    unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>::
    operator=(&this->m_pSslCon,
              (unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               *)local_20);
    std::
    unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>::
    ~unique_ptr((unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                 *)local_20);
    pSVar2 = std::
             unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ::operator->(&this->m_pSslCon);
    local_68[1] = 0;
    local_68[0] = 0x11;
    local_70 = this;
    std::bind<void(BaseSocketImpl::*)(),SslTcpSocketImpl*>(&local_58,local_68,&local_70);
    std::function<void()>::function<std::_Bind<void(BaseSocketImpl::*(SslTcpSocketImpl*))()>,void>
              ((function<void()> *)&local_40,&local_58);
    OpenSSLWrapper::SslConnection::SetErrorCb(pSVar2,&local_40);
    std::function<void_()>::~function(&local_40);
    pSVar2 = std::
             unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ::operator->(&this->m_pSslCon);
    OpenSSLWrapper::SslConnection::SetUserData(pSVar2,0,fnForwarder_abi_cxx11_);
    pSVar2 = std::
             unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ::operator->(&this->m_pSslCon);
    OpenSSLWrapper::SslConnection::SetUserData(pSVar2,1,this);
    pSVar2 = std::
             unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ::operator->(&this->m_pSslCon);
    OpenSSLWrapper::SslConnection::SSLSetAcceptState(pSVar2);
    std::mutex::lock(&(this->super_TcpSocketImpl).m_mxInDeque);
    while( true ) {
      sVar1 = std::
              deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
              ::size(&(this->super_TcpSocketImpl).m_quInData);
      if (sVar1 == 0) break;
      this_01 = &(this->super_TcpSocketImpl).m_quInData;
      pvVar3 = std::
               deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
               ::front(this_01);
      std::
      tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
      ::tuple((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
               *)local_90,pvVar3);
      std::
      deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
      ::pop_front(this_01);
      nToCopy._7_1_ = 0;
      p_Var4 = std::
               get<1ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>
                         ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
                           *)local_90);
      __i = *p_Var4;
      std::__atomic_base<unsigned_long>::operator-=
                (&(this->super_TcpSocketImpl).m_atInBytes.super___atomic_base<unsigned_long>,__i);
      this_00 = std::
                get<0ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>
                          ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
                            *)local_90);
      buffer = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                         (this_00,0);
      DatenDecode(this,buffer,__i,(bool *)((long)&nToCopy + 7));
      std::
      tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
      ::~tuple((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
                *)local_90);
    }
    std::mutex::unlock(&(this->super_TcpSocketImpl).m_mxInDeque);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool SslTcpSocketImpl::SetAcceptState()
{
    if (m_pServerCtx.size() == 0)
        return false;

    m_pSslCon = make_unique<SslConnection>(m_pServerCtx.front());
    m_pSslCon->SetErrorCb(function<void()>(bind(&BaseSocketImpl::Close, this)));
    m_pSslCon->SetUserData(0, reinterpret_cast<void*>(&SslTcpSocketImpl::fnForwarder));
    m_pSslCon->SetUserData(1, this);

    m_pSslCon->SSLSetAcceptState();

    m_mxInDeque.lock();
    while (m_quInData.size() != 0)
    {
        DATA data = move(m_quInData.front());
        m_quInData.pop_front();

        bool bZeroReceived = false;
        const size_t nToCopy = BUFLEN(data);
        m_atInBytes -= nToCopy;
        DatenDecode(&BUFFER(data)[0], nToCopy, bZeroReceived);
    }
    m_mxInDeque.unlock();

    return true;
}